

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O2

Keylet * __thiscall
jbcoin::keylet::ticket_t::operator()
          (Keylet *__return_storage_ptr__,ticket_t *this,AccountID *id,uint32_t seq)

{
  getTicketIndex(&__return_storage_ptr__->key,id,seq);
  __return_storage_ptr__->type = ltTICKET;
  return __return_storage_ptr__;
}

Assistant:

Keylet ticket_t::operator()(AccountID const& id,
    std::uint32_t seq) const
{
    return { ltTICKET,
        getTicketIndex(id, seq) };
}